

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::get_tags_kmers128(int,int,std::set<unsigned_int,std::less<unsigned_int>,std::
allocator<unsigned_int>>,ReadSequenceBuffer&,bool)::StreamKmerFactory128::
produce_all_kmers(char_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>_>__
          (StreamKmerFactory128 *this,char *seq,
          vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers)

{
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *in_RSI;
  unsigned___int128 *in_RDI;
  bool bVar1;
  __uint128_t *unaff_retaddr;
  uchar in_stack_0000000f;
  KMerFactory128 *in_stack_00000010;
  char *s;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *last;
  unsigned___int128 *fkmer;
  
  *(undefined8 *)((long)in_RDI + 8) = 0;
  *(undefined8 *)((long)in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 1) = 0;
  *(undefined8 *)((long)in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  last = in_RSI;
  fkmer = in_RDI;
  while( true ) {
    bVar1 = false;
    if (*(char *)&(in_RSI->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                  )._M_impl.super__Vector_impl_data._M_start != '\0') {
      bVar1 = *(char *)&(in_RSI->
                        super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                        _M_impl.super__Vector_impl_data._M_start != '\n';
    }
    if (!bVar1) break;
    KMerFactory128::fillKBuf
              (in_stack_00000010,in_stack_0000000f,unaff_retaddr,fkmer,(int64_t *)last);
    if ((long)(ulong)(byte)*in_RDI <= *(long *)((long)in_RDI + 8)) {
      if (*(ulong *)((long)in_RDI + 0x28) < *(ulong *)((long)in_RDI + 0x18) ||
          *(ulong *)((long)in_RDI + 0x28) - *(ulong *)((long)in_RDI + 0x18) <
          (ulong)((ulong)in_RDI[2] < (ulong)in_RDI[1])) {
        std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
        emplace_back<unsigned__int128&>(in_RSI,in_RDI);
      }
      else {
        std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
        emplace_back<unsigned__int128&>(in_RSI,in_RDI);
      }
    }
    in_RSI = (vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)
             ((long)&(in_RSI->
                     super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

inline void produce_all_kmers(const char * seq, std::vector<__uint128_t> &mers){
            // TODO: Adjust for when K is larger than what fits in __uint128_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }